

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-term.c
# Opt level: O0

void Term_big_putch(wchar_t x,wchar_t y,wchar_t a,wchar_t c)

{
  undefined4 local_20;
  undefined4 local_1c;
  wchar_t vert;
  wchar_t hor;
  wchar_t c_local;
  wchar_t a_local;
  wchar_t y_local;
  wchar_t x_local;
  
  if (tile_width < 2) {
    for (local_20 = 1; local_20 < (int)(uint)tile_height; local_20 = local_20 + 1) {
      if ((a & 0x80U) == 0) {
        Term_putch(x,y + local_20,L'\x01',L' ');
      }
      else {
        Term_putch(x,y + local_20,L'ÿ',L'\xffffffff');
      }
    }
  }
  else {
    for (local_1c = 0; local_1c < (int)(uint)tile_width; local_1c = local_1c + 1) {
      if (local_1c != 0) {
        if ((a & 0x80U) == 0) {
          Term_putch(x + local_1c,y,L'\x01',L' ');
        }
        else {
          Term_putch(x + local_1c,y,L'ÿ',L'\xffffffff');
        }
      }
      for (local_20 = 1; local_20 < (int)(uint)tile_height; local_20 = local_20 + 1) {
        if ((a & 0x80U) == 0) {
          Term_putch(x + local_1c,y + local_20,L'\x01',L' ');
        }
        else {
          Term_putch(x + local_1c,y + local_20,L'ÿ',L'\xffffffff');
        }
      }
    }
  }
  return;
}

Assistant:

void Term_big_putch(int x, int y, int a, wchar_t c)
{
	int hor, vert;

	/* Avoid warning */
	(void)c;

	/* No tall skinny tiles */
	if (tile_width > 1) {
		/* Horizontal first */
		for (hor = 0; hor < tile_width; hor++) {
			/* Queue dummy character */
			if (hor != 0) {
				if (a & 0x80)
					Term_putch(x + hor, y, 255, -1);
				else
					Term_putch(x + hor, y, COLOUR_WHITE, L' ');
			}

			/* Now vertical */
			for (vert = 1; vert < tile_height; vert++) {
				/* Queue dummy character */
				if (a & 0x80)
					Term_putch(x + hor, y + vert, 255, -1);
				else
					Term_putch(x + hor, y + vert, COLOUR_WHITE, L' ');
			}
		}
	} else {
		/* Only vertical */
		for (vert = 1; vert < tile_height; vert++) {
			/* Queue dummy character */
			if (a & 0x80)
				Term_putch(x, y + vert, 255, -1);
			else
				Term_putch(x, y + vert, COLOUR_WHITE, L' ');
		}
	}
}